

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O2

void __thiscall
ami_nvar_t::nvar_entry_body_t::nvar_entry_body_t
          (nvar_entry_body_t *this,kstream *p__io,nvar_entry_t *p__parent,ami_nvar_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__nvar_entry_body_t_001809a8;
  (this->m_extended_header_hash)._M_dataplus._M_p = (pointer)&(this->m_extended_header_hash).field_2
  ;
  (this->m_extended_header_hash)._M_string_length = 0;
  (this->m_extended_header_hash).field_2._M_local_buf[0] = '\0';
  (this->m_guid)._M_dataplus._M_p = (pointer)&(this->m_guid).field_2;
  (this->m_guid)._M_string_length = 0;
  (this->m_guid).field_2._M_local_buf[0] = '\0';
  (this->m_ascii_name)._M_dataplus._M_p = (pointer)&(this->m_ascii_name).field_2;
  (this->m_ascii_name)._M_string_length = 0;
  (this->m_ascii_name).field_2._M_local_buf[0] = '\0';
  (this->m_invoke_data_start)._M_dataplus._M_p = (pointer)&(this->m_invoke_data_start).field_2;
  (this->m_invoke_data_start)._M_string_length = 0;
  (this->m_invoke_data_start).field_2._M_local_buf[0] = '\0';
  (this->m_data)._M_dataplus._M_p = (pointer)&(this->m_data).field_2;
  (this->m_data)._M_string_length = 0;
  (this->m_data).field_2._M_local_buf[0] = '\0';
  this->m__parent = p__parent;
  this->m__root = p__root;
  (this->m_ucs2_name)._M_t.
  super___uniq_ptr_impl<ami_nvar_t::ucs2_string_t,_std::default_delete<ami_nvar_t::ucs2_string_t>_>.
  _M_t.
  super__Tuple_impl<0UL,_ami_nvar_t::ucs2_string_t_*,_std::default_delete<ami_nvar_t::ucs2_string_t>_>
  .super__Head_base<0UL,_ami_nvar_t::ucs2_string_t_*,_false>._M_head_impl = (ucs2_string_t *)0x0;
  (this->m_extended_header_attributes)._M_t.
  super___uniq_ptr_impl<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
  .super__Head_base<0UL,_ami_nvar_t::nvar_extended_attributes_t_*,_false>._M_head_impl =
       (nvar_extended_attributes_t *)0x0;
  this->f_extended_header_attributes = false;
  this->f_data_start_offset = false;
  this->f_extended_header_size_field = false;
  this->f_extended_header_timestamp = false;
  this->f_data_size = false;
  this->f_extended_header_checksum = false;
  this->f_data_end_offset = false;
  this->f_extended_header_size = false;
  this->f_extended_header_hash = false;
  _read(this);
  return;
}

Assistant:

void ami_nvar_t::_read() {
    m_entries = std::unique_ptr<std::vector<std::unique_ptr<nvar_entry_t>>>(new std::vector<std::unique_ptr<nvar_entry_t>>());
    {
        int i = 0;
        nvar_entry_t* _;
        do {
            _ = new nvar_entry_t(m__io, this, m__root);
            m_entries->push_back(std::move(std::unique_ptr<nvar_entry_t>(_)));
            i++;
        } while (!( ((_->signature_first() != 78) || (_io()->is_eof())) ));
    }
}